

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O2

void __thiscall
ConfidentialTransactionContext_SequenceApiTestWithKey_Test::TestBody
          (ConfidentialTransactionContext_SequenceApiTestWithKey_Test *this)

{
  Txid *this_00;
  ConfidentialAssetId *this_01;
  Txid *this_02;
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  char *in_R9;
  long lVar4;
  Amount AVar5;
  initializer_list<cfd::UtxoData> __l;
  allocator local_1932;
  allocator local_1931;
  AssertionResult gtest_ar_;
  Privkey local_1910;
  string local_18f0;
  ByteData tx;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  txouts;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_18a0;
  Amount fee;
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ct_addrs;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  SigHashType local_1840;
  SigHashType local_1834;
  ElementsAddressFactory factory;
  ConfidentialTransactionContext txc;
  ElementsConfidentialAddress address;
  AssertionResult gtest_ar;
  UtxoData local_10a8;
  ElementsConfidentialAddress asset_address;
  UtxoData utxo2;
  UtxoData utxo1;
  
  cfd::ElementsAddressFactory::ElementsAddressFactory(&factory,kElementsRegtest);
  cfd::UtxoData::UtxoData(&utxo1);
  utxo1.block_height = 0;
  utxo1.binary_data = (void *)0x0;
  std::__cxx11::string::string
            ((string *)&utxo2,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",
             (allocator *)&address);
  cfd::core::Txid::Txid((Txid *)&gtest_ar,(string *)&utxo2);
  this_00 = &utxo1.txid;
  cfd::core::Txid::operator=(this_00,(Txid *)&gtest_ar);
  cfd::core::Txid::~Txid((Txid *)&gtest_ar);
  std::__cxx11::string::~string((string *)&utxo2);
  utxo1.vout = 0;
  std::__cxx11::string::string
            ((string *)&utxo2,"76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac",
             (allocator *)&address);
  cfd::core::Script::Script((Script *)&gtest_ar,(string *)&utxo2);
  cfd::core::Script::operator=(&utxo1.locking_script,(Script *)&gtest_ar);
  cfd::core::Script::~Script((Script *)&gtest_ar);
  std::__cxx11::string::~string((string *)&utxo2);
  std::__cxx11::string::string
            ((string *)&utxo2,"2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph",(allocator *)&address);
  cfd::AddressFactory::GetAddress
            ((Address *)&gtest_ar,&factory.super_AddressFactory,(string *)&utxo2);
  cfd::core::Address::operator=(&utxo1.address,(Address *)&gtest_ar);
  cfd::core::Address::~Address((Address *)&gtest_ar);
  std::__cxx11::string::~string((string *)&utxo2);
  std::__cxx11::string::assign((char *)&utxo1.descriptor);
  cfd::core::Amount::Amount((Amount *)&gtest_ar,10000000);
  utxo1.amount.ignore_check_ = (bool)gtest_ar.message_.ptr_._0_1_;
  utxo1.amount.amount_ = gtest_ar._0_8_;
  utxo1.address_type = kP2pkhAddress;
  std::__cxx11::string::string
            ((string *)&utxo2,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
             (allocator *)&address);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)&gtest_ar,(string *)&utxo2);
  this_01 = &utxo1.asset;
  cfd::core::ConfidentialAssetId::operator=(this_01,(ConfidentialAssetId *)&gtest_ar);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&gtest_ar);
  std::__cxx11::string::~string((string *)&utxo2);
  cfd::UtxoData::UtxoData(&utxo2);
  utxo2.block_height = 0;
  utxo2.binary_data = (void *)0x0;
  std::__cxx11::string::string
            ((string *)&address,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3",
             (allocator *)&asset_address);
  cfd::core::Txid::Txid((Txid *)&gtest_ar,(string *)&address);
  this_02 = &utxo2.txid;
  cfd::core::Txid::operator=(this_02,(Txid *)&gtest_ar);
  cfd::core::Txid::~Txid((Txid *)&gtest_ar);
  std::__cxx11::string::~string((string *)&address);
  utxo2.vout = 0;
  std::__cxx11::string::string
            ((string *)&address,"a9145d54db96a28f844a744e393fcd699d6f825b284187",
             (allocator *)&asset_address);
  cfd::core::Script::Script((Script *)&gtest_ar,(string *)&address);
  cfd::core::Script::operator=(&utxo2.locking_script,(Script *)&gtest_ar);
  cfd::core::Script::~Script((Script *)&gtest_ar);
  std::__cxx11::string::~string((string *)&address);
  std::__cxx11::string::string
            ((string *)&address,"XKrjM1JtrjasbbrdJ9Ci51dmkZ1DMxzPJE",(allocator *)&asset_address);
  cfd::AddressFactory::GetAddress
            ((Address *)&gtest_ar,&factory.super_AddressFactory,(string *)&address);
  cfd::core::Address::operator=(&utxo2.address,(Address *)&gtest_ar);
  cfd::core::Address::~Address((Address *)&gtest_ar);
  std::__cxx11::string::~string((string *)&address);
  std::__cxx11::string::assign((char *)&utxo2.descriptor);
  cfd::core::Amount::Amount((Amount *)&gtest_ar,180000);
  utxo2.amount.ignore_check_ = (bool)gtest_ar.message_.ptr_._0_1_;
  utxo2.amount.amount_ = gtest_ar._0_8_;
  utxo2.address_type = kP2shP2wpkhAddress;
  std::__cxx11::string::string
            ((string *)&address,"849cabdb3b0df8a05b97c5df0f2e2f891d5a94fccf6dbe9907ee34b477a1e735",
             (allocator *)&asset_address);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)&gtest_ar,(string *)&address);
  cfd::core::ConfidentialAssetId::operator=(&utxo2.asset,(ConfidentialAssetId *)&gtest_ar);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&gtest_ar);
  std::__cxx11::string::~string((string *)&address);
  std::__cxx11::string::string
            ((string *)&address,"23b44363de1069842dff58ac6c965f75af71949e58d823d7bfcc963134db0b3e",
             (allocator *)&asset_address);
  cfd::core::BlindFactor::BlindFactor((BlindFactor *)&gtest_ar,(string *)&address);
  cfd::core::BlindFactor::operator=(&utxo2.asset_blind_factor,(BlindFactor *)&gtest_ar);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)&gtest_ar);
  std::__cxx11::string::~string((string *)&address);
  std::__cxx11::string::string
            ((string *)&address,"6dfe8c49f10c40cac178da4056dbf55eb11fa26e3169f41019e88252d86c42bc",
             (allocator *)&asset_address);
  cfd::core::BlindFactor::BlindFactor((BlindFactor *)&gtest_ar,(string *)&address);
  cfd::core::BlindFactor::operator=(&utxo2.amount_blind_factor,(BlindFactor *)&gtest_ar);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)&gtest_ar);
  std::__cxx11::string::~string((string *)&address);
  std::__cxx11::string::string
            ((string *)&address,"09da970d871982c2405b2d4bff4f455e4907bedaf95c205f94015809f6bd9c59fa"
             ,(allocator *)&asset_address);
  cfd::core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)&gtest_ar,(string *)&address)
  ;
  cfd::core::ConfidentialValue::operator=(&utxo2.value_commitment,(ConfidentialValue *)&gtest_ar);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&gtest_ar);
  std::__cxx11::string::~string((string *)&address);
  std::__cxx11::string::string
            ((string *)&gtest_ar,
             "CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3ggeFikyDxDW5gU8WmTXtb2HWWjc23YXZz",
             (allocator *)&asset_address);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(&address,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string
            ((string *)&gtest_ar,
             "CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3VHXTF8dZAhKb1iBAnzYXEj527CSdfj2PS",
             (allocator *)&txc);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&asset_address,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  cfd::core::Amount::Amount(&fee,10000);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&txc,2,0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::AddInput(&txc,&utxo1);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x2ff,
               "Expected: txc.AddInput(utxo1) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  cfd::core::OutPoint::OutPoint((OutPoint *)&gtest_ar,this_02,utxo2.vout);
  cfd::ConfidentialTransactionContext::AddTxIn(&txc,(OutPoint *)&gtest_ar);
  cfd::core::Txid::~Txid((Txid *)&gtest_ar);
  AVar5 = cfd::core::operator-(&utxo1.amount,&fee);
  gtest_ar._0_8_ = AVar5.amount_;
  gtest_ar.message_.ptr_._0_1_ = AVar5.ignore_check_;
  cfd::ConfidentialTransactionContext::AddTxOut(&txc,&address,(Amount *)&gtest_ar,this_01,false);
  cfd::core::ElementsConfidentialAddress::GetUnblindedAddress((Address *)&gtest_ar,&asset_address);
  cfd::ConfidentialTransactionContext::AddTxOut
            (&txc,(Address *)&gtest_ar,&utxo2.amount,&utxo2.asset);
  cfd::core::Address::~Address((Address *)&gtest_ar);
  cfd::core::ConfidentialTransaction::AddTxOutFee(&txc.super_ConfidentialTransaction,&fee,this_01);
  cfd::UtxoData::UtxoData((UtxoData *)&gtest_ar,&utxo1);
  cfd::UtxoData::UtxoData(&local_10a8,&utxo2);
  __l._M_len = 2;
  __l._M_array = (iterator)&gtest_ar;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            (&utxos,__l,(allocator_type *)&gtest_ar_);
  lVar4 = 0x4f0;
  do {
    cfd::UtxoData::~UtxoData((UtxoData *)(&gtest_ar.success_ + lVar4));
    lVar4 = lVar4 + -0x4f0;
  } while (lVar4 != -0x4f0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::CollectInputUtxo(&txc,&utxos);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x306,
               "Expected: txc.CollectInputUtxo(utxos) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  ct_addrs.
  super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ct_addrs.
  super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ct_addrs.
  super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back(&ct_addrs,&asset_address);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      in_R9 = (char *)0x0;
      cfd::ConfidentialTransactionContext::Blind
                (&txc,&ct_addrs,1,0,0x34,
                 (vector<cfd::core::BlindData,_std::allocator<cfd::core::BlindData>_> *)0x0);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x30a,
               "Expected: txc.Blind(&ct_addrs) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  cfd::core::ConfidentialTransaction::GetTxOutList(&txouts,&txc.super_ConfidentialTransaction);
  gtest_ar_._0_8_ =
       ((long)txouts.
              super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
              ._M_impl.super__Vector_impl_data._M_finish -
       (long)txouts.
             super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
             ._M_impl.super__Vector_impl_data._M_start) / 0xf8;
  local_1910.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"txouts.size()","3",(unsigned_long *)&gtest_ar_,
             (int *)&local_1910);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1910,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x30c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1910,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1910);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  if ((long)txouts.
            super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)txouts.
            super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x2e8) {
    cfd::core::ConfidentialValue::ConfidentialValue
              ((ConfidentialValue *)&gtest_ar,
               &(txouts.
                 super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                 ._M_impl.super__Vector_impl_data._M_start)->confidential_value_);
    bVar1 = cfd::core::ConfidentialValue::HasBlinding((ConfidentialValue *)&gtest_ar);
    gtest_ar_.success_ = bVar1;
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&gtest_ar);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&local_1910);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,
                 (AssertionResult *)"txouts[0].GetConfidentialValue().HasBlinding()","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_18f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
                 ,0x30e,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_18f0,(Message *)&local_1910)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_18f0);
      std::__cxx11::string::~string((string *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1910);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    cfd::core::ConfidentialValue::ConfidentialValue
              ((ConfidentialValue *)&gtest_ar,
               &txouts.
                super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                ._M_impl.super__Vector_impl_data._M_start[1].confidential_value_);
    bVar1 = cfd::core::ConfidentialValue::HasBlinding((ConfidentialValue *)&gtest_ar);
    gtest_ar_.success_ = bVar1;
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&gtest_ar);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&local_1910);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,
                 (AssertionResult *)"txouts[1].GetConfidentialValue().HasBlinding()","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_18f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
                 ,0x30f,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_18f0,(Message *)&local_1910)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_18f0);
      std::__cxx11::string::~string((string *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1910);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    cfd::core::ConfidentialValue::ConfidentialValue
              ((ConfidentialValue *)&gtest_ar,
               &txouts.
                super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                ._M_impl.super__Vector_impl_data._M_start[2].confidential_value_);
    bVar1 = cfd::core::ConfidentialValue::HasBlinding((ConfidentialValue *)&gtest_ar);
    gtest_ar_.success_ = !bVar1;
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&gtest_ar);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&local_1910);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,
                 (AssertionResult *)"txouts[2].GetConfidentialValue().HasBlinding()","true","false",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_18f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
                 ,0x310,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_18f0,(Message *)&local_1910)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_18f0);
      std::__cxx11::string::~string((string *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1910);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
  }
  cfd::core::ByteData::ByteData(&tx);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint((OutPoint *)&gtest_ar,this_00,utxo1.vout);
      std::__cxx11::string::string
                ((string *)&gtest_ar_,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b",&local_1931);
      cfd::core::Pubkey::Pubkey((Pubkey *)&local_18a0,(string *)&gtest_ar_);
      std::__cxx11::string::string
                ((string *)&local_18f0,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5",
                 &local_1932);
      cfd::core::Privkey::FromWif(&local_1910,&local_18f0,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_1834);
      cfd::ConfidentialTransactionContext::SignWithKey
                (&txc,(OutPoint *)&gtest_ar,(Pubkey *)&local_18a0,&local_1910,&local_1834,true);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1910);
      std::__cxx11::string::~string((string *)&local_18f0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_18a0);
      std::__cxx11::string::~string((string *)&gtest_ar_);
      cfd::core::Txid::~Txid((Txid *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x318,
               "Expected: txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint((OutPoint *)&gtest_ar,this_00,utxo1.vout);
      cfd::ConfidentialTransactionContext::Verify(&txc,(OutPoint *)&gtest_ar);
      cfd::core::Txid::~Txid((Txid *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x319,
               "Expected: txc.Verify(OutPoint(utxo1.txid, utxo1.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::ConfidentialTransactionContext::Finalize((ByteData *)&gtest_ar,&txc);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&tx,&gtest_ar);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  }
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
             ,0x31b,
             "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint((OutPoint *)&gtest_ar,this_02,utxo2.vout);
      std::__cxx11::string::string
                ((string *)&gtest_ar_,
                 "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27",&local_1931);
      cfd::core::Pubkey::Pubkey((Pubkey *)&local_18a0,(string *)&gtest_ar_);
      std::__cxx11::string::string
                ((string *)&local_18f0,"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP",
                 &local_1932);
      cfd::core::Privkey::FromWif(&local_1910,&local_18f0,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_1840);
      cfd::ConfidentialTransactionContext::SignWithKey
                (&txc,(OutPoint *)&gtest_ar,(Pubkey *)&local_18a0,&local_1910,&local_1840,true);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1910);
      std::__cxx11::string::~string((string *)&local_18f0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_18a0);
      std::__cxx11::string::~string((string *)&gtest_ar_);
      cfd::core::Txid::~Txid((Txid *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,800,
               "Expected: txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout), Pubkey(\"0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27\"), Privkey::FromWif( \"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint((OutPoint *)&gtest_ar,this_02,utxo2.vout);
      cfd::ConfidentialTransactionContext::Verify(&txc,(OutPoint *)&gtest_ar);
      cfd::core::Txid::~Txid((Txid *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x321,
               "Expected: txc.Verify(OutPoint(utxo2.txid, utxo2.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::Finalize((ByteData *)&gtest_ar,&txc);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&tx,&gtest_ar);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x322,
               "Expected: tx = txc.Finalize() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  sVar2 = cfd::core::ByteData::GetDataSize(&tx);
  if (sVar2 != 0x23e1) {
    sVar2 = cfd::core::ByteData::GetDataSize(&tx);
    if (sVar2 != 0x23e2) {
      sVar2 = cfd::core::ByteData::GetDataSize(&tx);
      if (sVar2 != 0x23e3) {
        local_1910.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
        gtest_ar_._0_8_ = cfd::core::ByteData::GetDataSize(&tx);
        testing::internal::CmpHelperEQ<int,unsigned_long>
                  ((internal *)&gtest_ar,"0","tx.GetDataSize()",(int *)&local_1910,
                   (unsigned_long *)&gtest_ar_);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
              (undefined8 *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_1910,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
                     ,0x325,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_1910,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1910);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar_);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
      }
    }
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tx);
  std::
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  ::~vector(&txouts);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::~vector(&ct_addrs);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&utxos);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&txc);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&asset_address);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&address);
  cfd::UtxoData::~UtxoData(&utxo2);
  cfd::UtxoData::~UtxoData(&utxo1);
  cfd::AddressFactory::~AddressFactory(&factory.super_AddressFactory);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, SequenceApiTestWithKey)
{
  ElementsAddressFactory factory(NetType::kElementsRegtest);
  // Address1
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo1.vout = 0;
  utxo1.locking_script = Script("76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac");
  // utxo1.redeem_script = Script("");
  utxo1.address = factory.GetAddress("2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph");
  utxo1.descriptor = "pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo1.amount = Amount(int64_t{10000000});
  utxo1.address_type = AddressType::kP2pkhAddress;
  utxo1.asset = ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");
  // utxo1.asset_blind_factor = BlindFactor("");
  // utxo1.amount_blind_factor = BlindFactor("");
  // utxo1.value_commitment = ConfidentialValue("");

  // Address2 (pattern-x1)
  // pubkey: '0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27',
  // privkey: 'cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP'
  // blinding key: '66e4df5035a64acef16b4aa52ddc8bebd22b22c9eca150774e355abc72909d83'
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo2.vout = 0;
  utxo2.locking_script = Script("a9145d54db96a28f844a744e393fcd699d6f825b284187");
  // utxo1.redeem_script = Script("");
  utxo2.address = factory.GetAddress("XKrjM1JtrjasbbrdJ9Ci51dmkZ1DMxzPJE");
  utxo2.descriptor = "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))";
  utxo2.amount = Amount(int64_t{180000});
  utxo2.address_type = AddressType::kP2shP2wpkhAddress;
  utxo2.asset = ConfidentialAssetId("849cabdb3b0df8a05b97c5df0f2e2f891d5a94fccf6dbe9907ee34b477a1e735");
  // utxo2.confidential_address;
  utxo2.asset_blind_factor = BlindFactor("23b44363de1069842dff58ac6c965f75af71949e58d823d7bfcc963134db0b3e");
  utxo2.amount_blind_factor = BlindFactor("6dfe8c49f10c40cac178da4056dbf55eb11fa26e3169f41019e88252d86c42bc");
  utxo2.value_commitment = ConfidentialValue("09da970d871982c2405b2d4bff4f455e4907bedaf95c205f94015809f6bd9c59fa");

  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  ElementsConfidentialAddress address("CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3ggeFikyDxDW5gU8WmTXtb2HWWjc23YXZz");
  // "2dbH8YS7rqRDM1F7EXrGBXvZywXxuEQtZ2z"
  ElementsConfidentialAddress asset_address("CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3VHXTF8dZAhKb1iBAnzYXEj527CSdfj2PS");

  Amount fee(int64_t{10000});
  ConfidentialTransactionContext txc(2, 0);
  EXPECT_NO_THROW(txc.AddInput(utxo1));
  txc.AddTxIn(OutPoint(utxo2.txid, utxo2.vout));
  txc.AddTxOut(address, utxo1.amount - fee, utxo1.asset);
  txc.AddTxOut(asset_address.GetUnblindedAddress(), utxo2.amount, utxo2.asset);
  txc.AddTxOutFee(fee, utxo1.asset);

  std::vector<cfd::UtxoData> utxos{utxo1, utxo2};
  EXPECT_NO_THROW(txc.CollectInputUtxo(utxos));

  std::vector<cfd::core::ElementsConfidentialAddress> ct_addrs;
  ct_addrs.push_back(asset_address);
  EXPECT_NO_THROW(txc.Blind(&ct_addrs));
  std::vector<ConfidentialTxOutReference> txouts = txc.GetTxOutList();
  EXPECT_EQ(txouts.size(), 3);
  if (txouts.size() == 3) {
    EXPECT_TRUE(txouts[0].GetConfidentialValue().HasBlinding());
    EXPECT_TRUE(txouts[1].GetConfidentialValue().HasBlinding());
    EXPECT_FALSE(txouts[2].GetConfidentialValue().HasBlinding());
  }

  ByteData tx;

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo1.txid, utxo1.vout)));

  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout),
      Pubkey("0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"),
      Privkey::FromWif(
          "cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo2.txid, utxo2.vout)));
  EXPECT_NO_THROW(tx = txc.Finalize());

  if ((tx.GetDataSize() != 9185) && (tx.GetDataSize() != 9186) && (tx.GetDataSize() != 9187)) {
    EXPECT_EQ(0, tx.GetDataSize());
  }
}